

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

void __thiscall cmCTestTestHandler::UpdateForFixtures(cmCTestTestHandler *this,ListOfTests *tests)

{
  char **ppcVar1;
  char **ppcVar2;
  cmCTest *pcVar3;
  pointer pcVar4;
  iterator iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  value_type *pvVar6;
  _Base_ptr p_Var7;
  unsigned_long uVar8;
  bool bVar9;
  long *plVar10;
  _Rb_tree_node_base *p_Var11;
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar12;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var13;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>
  _Var14;
  ostream *poVar15;
  _Base_ptr p_Var16;
  iterator iVar17;
  long *plVar18;
  size_type *psVar19;
  pointer __v_00;
  cmCTestTestProperties *p;
  pointer pcVar20;
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  *pvVar21;
  _Base_ptr p_Var22;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>
  sIt;
  pointer pcVar23;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
  pVar24;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar25;
  ListOfTests *__range1;
  string cleanupRegExp;
  string setupRegExp;
  FixtureDependencies fixtureSetups;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fixtures;
  ostringstream cmCTestLog_msg;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  setupFixturesAdded;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  fixtureRequirements;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addedTests;
  RegularExpression excludeSetupRegex;
  FixtureDependencies fixtureCleanups;
  RegularExpression excludeCleanupRegex;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addedFixtures;
  unsigned_long local_528;
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  *local_520;
  _Rb_tree_node_base *local_518;
  long local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  long *local_4e8;
  long local_4d8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  undefined1 local_4a8 [32];
  _Base_ptr local_488;
  size_t local_480;
  pointer local_478;
  _Base_ptr local_470;
  char *local_468;
  _Rb_tree_node_base local_460;
  undefined1 local_438 [32];
  __normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
  local_418;
  ios_base local_3c8 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_2c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_290;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  RegularExpression local_230;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
  local_160;
  RegularExpression local_130;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_438,"Updating test list for fixtures",0x1f);
  std::ios::widen((char)(ostringstream *)local_438 + (char)*(undefined8 *)(local_438._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_438);
  std::ostream::flush();
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x3d3,local_230.regmatch.startp[0],(this->super_cmCTestGenericHandler).Quiet);
  ppcVar1 = local_230.regmatch.startp + 2;
  if ((char **)local_230.regmatch.startp[0] != ppcVar1) {
    operator_delete(local_230.regmatch.startp[0],(ulong)(local_230.regmatch.startp[2] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  pcVar4 = (this->ExcludeFixtureRegExp)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4c8,pcVar4,pcVar4 + (this->ExcludeFixtureRegExp)._M_string_length);
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  pcVar4 = (this->ExcludeFixtureRegExp)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_508,pcVar4,pcVar4 + (this->ExcludeFixtureRegExp)._M_string_length);
  if ((this->ExcludeFixtureSetupRegExp)._M_string_length != 0) {
    if (local_4c8._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&local_4c8);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8,
                     "(",&local_4c8);
      plVar10 = (long *)std::__cxx11::string::append(local_4a8);
      ppcVar2 = local_130.regmatch.startp + 2;
      plVar18 = plVar10 + 2;
      if ((char **)*plVar10 == (char **)plVar18) {
        local_130.regmatch.startp[2] = (char *)*plVar18;
        local_130.regmatch.startp[3] = (char *)plVar10[3];
        local_130.regmatch.startp[0] = (char *)ppcVar2;
      }
      else {
        local_130.regmatch.startp[2] = (char *)*plVar18;
        local_130.regmatch.startp[0] = (char *)*plVar10;
      }
      local_130.regmatch.startp[1] = (char *)plVar10[1];
      *plVar10 = (long)plVar18;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_130,
                                   (ulong)(this->ExcludeFixtureSetupRegExp)._M_dataplus._M_p);
      plVar18 = plVar10 + 2;
      if ((char **)*plVar10 == (char **)plVar18) {
        local_230.regmatch.startp[2] = (char *)*plVar18;
        local_230.regmatch.startp[3] = (char *)plVar10[3];
        local_230.regmatch.startp[0] = (char *)ppcVar1;
      }
      else {
        local_230.regmatch.startp[2] = (char *)*plVar18;
        local_230.regmatch.startp[0] = (char *)*plVar10;
      }
      local_230.regmatch.startp[1] = (char *)plVar10[1];
      *plVar10 = (long)plVar18;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_230);
      psVar19 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar19) {
        local_438._16_8_ = *psVar19;
        local_438._24_8_ = plVar10[3];
        local_438._0_8_ = local_438 + 0x10;
      }
      else {
        local_438._16_8_ = *psVar19;
        local_438._0_8_ = (size_type *)*plVar10;
      }
      local_438._8_8_ = plVar10[1];
      *plVar10 = (long)psVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_4c8,local_438._0_8_);
      if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
        operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
      }
      if ((char **)local_230.regmatch.startp[0] != ppcVar1) {
        operator_delete(local_230.regmatch.startp[0],(ulong)(local_230.regmatch.startp[2] + 1));
      }
      if ((char **)local_130.regmatch.startp[0] != ppcVar2) {
        operator_delete(local_130.regmatch.startp[0],(ulong)(local_130.regmatch.startp[2] + 1));
      }
      if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
        operator_delete((void *)local_4a8._0_8_,local_4a8._16_8_ + 1);
      }
    }
  }
  if ((this->ExcludeFixtureCleanupRegExp)._M_string_length != 0) {
    if (local_508._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&local_508);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8,
                     "(",&local_508);
      plVar10 = (long *)std::__cxx11::string::append(local_4a8);
      ppcVar2 = local_130.regmatch.startp + 2;
      plVar18 = plVar10 + 2;
      if ((char **)*plVar10 == (char **)plVar18) {
        local_130.regmatch.startp[2] = (char *)*plVar18;
        local_130.regmatch.startp[3] = (char *)plVar10[3];
        local_130.regmatch.startp[0] = (char *)ppcVar2;
      }
      else {
        local_130.regmatch.startp[2] = (char *)*plVar18;
        local_130.regmatch.startp[0] = (char *)*plVar10;
      }
      local_130.regmatch.startp[1] = (char *)plVar10[1];
      *plVar10 = (long)plVar18;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_130,
                                   (ulong)(this->ExcludeFixtureCleanupRegExp)._M_dataplus._M_p);
      plVar18 = plVar10 + 2;
      if ((char **)*plVar10 == (char **)plVar18) {
        local_230.regmatch.startp[2] = (char *)*plVar18;
        local_230.regmatch.startp[3] = (char *)plVar10[3];
        local_230.regmatch.startp[0] = (char *)ppcVar1;
      }
      else {
        local_230.regmatch.startp[2] = (char *)*plVar18;
        local_230.regmatch.startp[0] = (char *)*plVar10;
      }
      local_230.regmatch.startp[1] = (char *)plVar10[1];
      *plVar10 = (long)plVar18;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_230);
      psVar19 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar19) {
        local_438._16_8_ = *psVar19;
        local_438._24_8_ = plVar10[3];
        local_438._0_8_ = local_438 + 0x10;
      }
      else {
        local_438._16_8_ = *psVar19;
        local_438._0_8_ = (size_type *)*plVar10;
      }
      local_438._8_8_ = plVar10[1];
      *plVar10 = (long)psVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_508,local_438._0_8_);
      if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
        operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
      }
      if ((char **)local_230.regmatch.startp[0] != ppcVar1) {
        operator_delete(local_230.regmatch.startp[0],(ulong)(local_230.regmatch.startp[2] + 1));
      }
      if ((char **)local_130.regmatch.startp[0] != ppcVar2) {
        operator_delete(local_130.regmatch.startp[0],(ulong)(local_130.regmatch.startp[2] + 1));
      }
      if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
        operator_delete((void *)local_4a8._0_8_,local_4a8._16_8_ + 1);
      }
    }
  }
  local_230.regmust = (char *)0x0;
  local_230.program = (char *)0x0;
  local_230.progsize = 0;
  memset(&local_230,0,0xaa);
  cmsys::RegularExpression::compile(&local_230,local_4c8._M_dataplus._M_p);
  local_130.regmust = (char *)0x0;
  local_130.program = (char *)0x0;
  local_130.progsize = 0;
  local_520 = tests;
  memset(&local_130,0,0xaa);
  cmsys::RegularExpression::compile(&local_130,local_508._M_dataplus._M_p);
  local_4a8._24_8_ = local_4a8 + 8;
  local_4a8._8_4_ = _S_red;
  local_4a8._16_8_ = 0;
  local_480 = 0;
  local_160._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_160._M_impl.super__Rb_tree_header._M_header;
  local_160._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_160._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_160._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar23 = (this->TestList).
            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_488 = (_Base_ptr)local_4a8._24_8_;
  local_160._M_impl.super__Rb_tree_header._M_header._M_right =
       local_160._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pcVar23 !=
      (this->TestList).
      super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar4 = local_438 + 0x10;
    do {
      for (p_Var11 = (pcVar23->FixturesSetup)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var11 != &(pcVar23->FixturesSetup)._M_t._M_impl.super__Rb_tree_header
          ; p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
        local_438._0_8_ = pcVar4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_438,*(long *)(p_Var11 + 1),
                   (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
        local_418._M_current = pcVar23;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>>
        ::
        _M_emplace_equal<std::pair<std::__cxx11::string,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>>
                    *)local_4a8,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>
                    *)local_438);
        if ((pointer)local_438._0_8_ != pcVar4) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
      }
      for (p_Var11 = (pcVar23->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          ; (_Rb_tree_header *)p_Var11 !=
            &(pcVar23->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header;
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
        local_438._0_8_ = pcVar4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_438,*(long *)(p_Var11 + 1),
                   (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
        local_418._M_current = pcVar23;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>>
        ::
        _M_emplace_equal<std::pair<std::__cxx11::string,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>>
                    *)&local_160,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>
                    *)local_438);
        if ((pointer)local_438._0_8_ != pcVar4) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
      }
      pcVar23 = pcVar23 + 1;
    } while (pcVar23 !=
             (this->TestList).
             super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pvVar21 = local_520;
  local_260._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_260._M_impl.super__Rb_tree_header._M_header;
  local_260._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_260._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_260._M_impl.super__Rb_tree_header._M_node_count = 0;
  __v_00 = (local_520->
           super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar23 = (local_520->
            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pcVar20 = __v_00;
  local_260._M_impl.super__Rb_tree_header._M_header._M_right =
       local_260._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__v_00 != pcVar23) {
    do {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_260,&__v_00->Name);
      __v_00 = __v_00 + 1;
    } while (__v_00 != pcVar23);
    __v_00 = (pvVar21->
             super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pcVar20 = (pvVar21->
              super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  local_290._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_290._M_impl.super__Rb_tree_header._M_header;
  local_290._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_290._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_290._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2c0._M_impl.super__Rb_tree_header._M_header;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_528 = 0;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_290._M_impl.super__Rb_tree_header._M_header._M_right =
       local_290._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__v_00 != pcVar20) {
    local_510 = 0;
    do {
      if (pcVar20[local_528].Disabled == false) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_468,&pcVar20[local_528].FixturesRequired._M_t);
        for (p_Var16 = local_460._M_left; p_Var16 != &local_460;
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
          if (p_Var16[1]._M_parent != (_Base_ptr)0x0) {
            p_Var11 = p_Var16 + 1;
            pvVar12 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                    *)&local_290,(key_type *)p_Var11);
            iVar5._M_current = *(unsigned_long **)(pvVar12 + 8);
            if (iVar5._M_current == *(unsigned_long **)(pvVar12 + 0x10)) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(pvVar12,iVar5,&local_528);
            }
            else {
              *iVar5._M_current = local_528;
              *(unsigned_long **)(pvVar12 + 8) = iVar5._M_current + 1;
            }
            local_518 = p_Var11;
            pVar24 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
                     ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
                                    *)local_4a8,(key_type *)p_Var11);
            _Var14 = pVar24.first._M_node;
            p_Var11 = local_518;
            while (local_518 = p_Var11, _Var14._M_node != pVar24.second._M_node._M_node) {
              __v = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     (_Var14._M_node + 2);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&(pvVar21->
                             super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                             )._M_impl.super__Vector_impl_data._M_start[local_528].
                             RequireSuccessDepends,__v);
              uVar8 = local_528;
              pcVar23 = (local_520->
                        super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              _Var13 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 (pcVar23[local_528].Depends.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  *(pointer *)
                                   ((long)&pcVar23[local_528].Depends.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl + 8),__v);
              if (_Var13._M_current ==
                  *(pointer *)
                   ((long)&pcVar23[uVar8].Depends.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl + 8)) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&(local_520->
                             super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                             )._M_impl.super__Vector_impl_data._M_start[local_528].Depends,__v);
              }
              _Var14._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var14._M_node);
              pvVar21 = local_520;
              p_Var11 = local_518;
            }
            pVar25 = std::
                     _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     ::_M_insert_unique<std::__cxx11::string_const&>
                               ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)&local_60,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )p_Var11);
            if (((undefined1  [16])pVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              if ((local_4c8._M_string_length == 0) ||
                 (bVar9 = cmsys::RegularExpression::find
                                    (&local_230,*(char **)p_Var11,&local_230.regmatch), !bVar9)) {
                pVar24 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
                         ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
                                        *)local_4a8,(key_type *)p_Var11);
                for (_Var14 = pVar24.first._M_node; _Var14._M_node != pVar24.second._M_node._M_node;
                    _Var14._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var14._M_node)) {
                  pvVar6 = *(value_type **)(_Var14._M_node + 2);
                  pVar25 = std::
                           _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           ::_M_insert_unique<std::__cxx11::string_const&>
                                     ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                       *)&local_260,&pvVar6->Name);
                  if (((undefined1  [16])pVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    std::
                    vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                    ::push_back(pvVar21,pvVar6);
                    (pvVar21->
                    super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                    )._M_impl.super__Vector_impl_data._M_finish[-1].Index =
                         (int)((ulong)((long)pvVar6 -
                                      (long)(this->TestList).
                                            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 8) *
                         -0x55555555 + 1;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_438,"Added setup test ",0x11);
                    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_438,(pvVar6->Name)._M_dataplus._M_p,
                                         (pvVar6->Name)._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15," required by fixture ",0x15);
                    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar15,*(char **)(p_Var16 + 1),(long)p_Var16[1]._M_parent)
                    ;
                    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
                    std::ostream::put((char)poVar15);
                    std::ostream::flush();
                    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar3,5,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                                 ,0x45d,(char *)local_4e8,(this->super_cmCTestGenericHandler).Quiet)
                    ;
                    if (local_4e8 != local_4d8) {
                      operator_delete(local_4e8,local_4d8[0] + 1);
                    }
                    local_510 = local_510 + 1;
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
                    std::ios_base::~ios_base(local_3c8);
                  }
                }
              }
              p_Var11 = local_518;
              if ((local_508._M_string_length == 0) ||
                 (bVar9 = cmsys::RegularExpression::find
                                    (&local_130,*(char **)local_518,&local_130.regmatch), !bVar9)) {
                pVar24 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
                         ::equal_range(&local_160,(key_type *)p_Var11);
                for (_Var14 = pVar24.first._M_node; _Var14._M_node != pVar24.second._M_node._M_node;
                    _Var14._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var14._M_node)) {
                  pvVar6 = *(value_type **)(_Var14._M_node + 2);
                  pVar25 = std::
                           _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           ::_M_insert_unique<std::__cxx11::string_const&>
                                     ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                       *)&local_260,&pvVar6->Name);
                  pvVar21 = local_520;
                  if (((undefined1  [16])pVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    std::
                    vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                    ::push_back(local_520,pvVar6);
                    (pvVar21->
                    super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                    )._M_impl.super__Vector_impl_data._M_finish[-1].Index =
                         (int)((ulong)((long)pvVar6 -
                                      (long)(this->TestList).
                                            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 8) *
                         -0x55555555 + 1;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_438,"Added cleanup test ",0x13);
                    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_438,(pvVar6->Name)._M_dataplus._M_p,
                                         (pvVar6->Name)._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15," required by fixture ",0x15);
                    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar15,*(char **)(p_Var16 + 1),(long)p_Var16[1]._M_parent)
                    ;
                    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
                    std::ostream::put((char)poVar15);
                    std::ostream::flush();
                    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar3,5,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                                 ,0x47c,(char *)local_4e8,(this->super_cmCTestGenericHandler).Quiet)
                    ;
                    if (local_4e8 != local_4d8) {
                      operator_delete(local_4e8,local_4d8[0] + 1);
                    }
                    local_510 = local_510 + 1;
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
                    std::ios_base::~ios_base(local_3c8);
                  }
                  pvVar21 = local_520;
                }
              }
            }
          }
        }
        pcVar23 = (pvVar21->
                  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pcVar20 = pcVar23 + local_528;
        for (p_Var16 = *(_Base_ptr *)((long)&pcVar23[local_528].FixturesSetup._M_t._M_impl + 0x18);
            p_Var16 != (_Rb_tree_node_base *)((long)&(pcVar20->FixturesSetup)._M_t._M_impl + 8U);
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
          if (p_Var16[1]._M_parent != (_Base_ptr)0x0) {
            pvVar12 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                    *)&local_2c0,(key_type *)(p_Var16 + 1));
            iVar5._M_current = *(unsigned_long **)(pvVar12 + 8);
            if (iVar5._M_current == *(unsigned_long **)(pvVar12 + 0x10)) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(pvVar12,iVar5,&local_528);
            }
            else {
              *iVar5._M_current = local_528;
              *(unsigned_long **)(pvVar12 + 8) = iVar5._M_current + 1;
            }
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_468);
        pcVar20 = (pvVar21->
                  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        __v_00 = (pvVar21->
                 super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      local_528 = local_528 + 1;
    } while (local_528 < (ulong)(((long)__v_00 - (long)pcVar20 >> 8) * -0x5555555555555555));
    for (; pcVar20 != __v_00; pcVar20 = pcVar20 + 1) {
      p_Var16 = (pcVar20->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_470 = &(pcVar20->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_478 = __v_00;
      if (p_Var16 != local_470) {
        do {
          iVar17 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::find(&local_290,(key_type *)(p_Var16 + 1));
          local_518 = p_Var16;
          if ((_Rb_tree_header *)iVar17._M_node != &local_290._M_impl.super__Rb_tree_header) {
            p_Var7 = iVar17._M_node[2]._M_parent;
            for (p_Var22 = *(_Base_ptr *)(iVar17._M_node + 2); p_Var22 != p_Var7;
                p_Var22 = (_Base_ptr)&p_Var22->_M_parent) {
              pcVar23 = (local_520->
                        super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                        )._M_impl.super__Vector_impl_data._M_start + *(long *)p_Var22;
              _Var13 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 ((pcVar20->Depends).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (pcVar20->Depends).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,pcVar23);
              if (_Var13._M_current ==
                  (pcVar20->Depends).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&pcVar20->Depends,&pcVar23->Name);
              }
            }
          }
          iVar17 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::find(&local_2c0,(key_type *)(p_Var16 + 1));
          pvVar21 = local_520;
          if ((_Rb_tree_header *)iVar17._M_node != &local_2c0._M_impl.super__Rb_tree_header) {
            p_Var22 = iVar17._M_node[2]._M_parent;
            for (p_Var16 = *(_Base_ptr *)(iVar17._M_node + 2); p_Var16 != p_Var22;
                p_Var16 = (_Base_ptr)&p_Var16->_M_parent) {
              pcVar23 = (pvVar21->
                        super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                        )._M_impl.super__Vector_impl_data._M_start + *(long *)p_Var16;
              _Var13 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 ((pcVar20->Depends).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (pcVar20->Depends).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,pcVar23);
              if (_Var13._M_current ==
                  (pcVar20->Depends).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&pcVar20->Depends,&pcVar23->Name);
              }
            }
          }
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(local_518);
        } while (p_Var16 != local_470);
      }
      __v_00 = local_478;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"Added ",6);
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)local_438);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar15," tests to meet fixture requirements",0x23);
  std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
  std::ostream::put((char)poVar15);
  std::ostream::flush();
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x4b4,local_468,(this->super_cmCTestGenericHandler).Quiet);
  if ((_Base_ptr *)local_468 != &local_460._M_parent) {
    operator_delete(local_468,(ulong)((long)&(local_460._M_parent)->_M_color + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~_Rb_tree(&local_2c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~_Rb_tree(&local_290);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_260);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
  ::~_Rb_tree(&local_160);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
               *)local_4a8);
  if (local_130.program != (char *)0x0) {
    operator_delete__(local_130.program);
  }
  if (local_230.program != (char *)0x0) {
    operator_delete__(local_230.program);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestTestHandler::UpdateForFixtures(ListOfTests& tests) const
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Updating test list for fixtures" << std::endl,
                     this->Quiet);

  // Prepare regular expression evaluators
  std::string setupRegExp(this->ExcludeFixtureRegExp);
  std::string cleanupRegExp(this->ExcludeFixtureRegExp);
  if (!this->ExcludeFixtureSetupRegExp.empty()) {
    if (setupRegExp.empty()) {
      setupRegExp = this->ExcludeFixtureSetupRegExp;
    } else {
      setupRegExp.append("(" + setupRegExp + ")|(" +
                         this->ExcludeFixtureSetupRegExp + ")");
    }
  }
  if (!this->ExcludeFixtureCleanupRegExp.empty()) {
    if (cleanupRegExp.empty()) {
      cleanupRegExp = this->ExcludeFixtureCleanupRegExp;
    } else {
      cleanupRegExp.append("(" + cleanupRegExp + ")|(" +
                           this->ExcludeFixtureCleanupRegExp + ")");
    }
  }
  cmsys::RegularExpression excludeSetupRegex(setupRegExp);
  cmsys::RegularExpression excludeCleanupRegex(cleanupRegExp);

  // Prepare some maps to help us find setup and cleanup tests for
  // any given fixture
  using TestIterator = ListOfTests::const_iterator;
  using FixtureDependencies = std::multimap<std::string, TestIterator>;
  using FixtureDepsIterator = FixtureDependencies::const_iterator;
  FixtureDependencies fixtureSetups;
  FixtureDependencies fixtureCleanups;

  for (auto it = this->TestList.begin(); it != this->TestList.end(); ++it) {
    const cmCTestTestProperties& p = *it;

    for (std::string const& deps : p.FixturesSetup) {
      fixtureSetups.insert(std::make_pair(deps, it));
    }

    for (std::string const& deps : p.FixturesCleanup) {
      fixtureCleanups.insert(std::make_pair(deps, it));
    }
  }

  // Prepare fast lookup of tests already included in our list of tests
  std::set<std::string> addedTests;
  for (cmCTestTestProperties const& p : tests) {
    addedTests.insert(p.Name);
  }

  // These are lookups of fixture name to a list of indices into the final
  // tests array for tests which require that fixture and tests which are
  // setups for that fixture. They are needed at the end to populate
  // dependencies of the cleanup tests in our final list of tests.
  std::map<std::string, std::vector<size_t>> fixtureRequirements;
  std::map<std::string, std::vector<size_t>> setupFixturesAdded;

  // Use integer index for iteration because we append to
  // the tests vector as we go
  size_t fixtureTestsAdded = 0;
  std::set<std::string> addedFixtures;
  for (size_t i = 0; i < tests.size(); ++i) {
    // Skip disabled tests
    if (tests[i].Disabled) {
      continue;
    }

    // There are two things to do for each test:
    //   1. For every fixture required by this test, record that fixture as
    //      being required and create dependencies on that fixture's setup
    //      tests.
    //   2. Record all setup tests in the final test list so we can later make
    //      cleanup tests in the test list depend on their associated setup
    //      tests to enforce correct ordering.

    // 1. Handle fixture requirements
    //
    // Must copy the set of fixtures required because we may invalidate
    // the tests array by appending to it
    std::set<std::string> fixtures = tests[i].FixturesRequired;
    for (std::string const& requiredFixtureName : fixtures) {
      if (requiredFixtureName.empty()) {
        continue;
      }

      fixtureRequirements[requiredFixtureName].push_back(i);

      // Add dependencies to this test for all of the setup tests
      // associated with the required fixture. If any of those setup
      // tests fail, this test should not run. We make the fixture's
      // cleanup tests depend on this test case later.
      std::pair<FixtureDepsIterator, FixtureDepsIterator> setupRange =
        fixtureSetups.equal_range(requiredFixtureName);
      for (auto sIt = setupRange.first; sIt != setupRange.second; ++sIt) {
        const std::string& setupTestName = sIt->second->Name;
        tests[i].RequireSuccessDepends.insert(setupTestName);
        if (!cm::contains(tests[i].Depends, setupTestName)) {
          tests[i].Depends.push_back(setupTestName);
        }
      }

      // Append any fixture setup/cleanup tests to our test list if they
      // are not already in it (they could have been in the original
      // set of tests passed to us at the outset or have already been
      // added from a previously checked test). A fixture isn't required
      // to have setup/cleanup tests.
      if (!addedFixtures.insert(requiredFixtureName).second) {
        // Already seen this fixture, no need to check it again
        continue;
      }

      // Only add setup tests if this fixture has not been excluded
      if (setupRegExp.empty() ||
          !excludeSetupRegex.find(requiredFixtureName)) {
        std::pair<FixtureDepsIterator, FixtureDepsIterator> fixtureRange =
          fixtureSetups.equal_range(requiredFixtureName);
        for (auto it = fixtureRange.first; it != fixtureRange.second; ++it) {
          ListOfTests::const_iterator lotIt = it->second;
          const cmCTestTestProperties& p = *lotIt;

          if (!addedTests.insert(p.Name).second) {
            // Already have p in our test list
            continue;
          }

          // This is a test not yet in our list, so add it and
          // update its index to reflect where it was in the original
          // full list of all tests (needed to track individual tests
          // across ctest runs for re-run failed, etc.)
          tests.push_back(p);
          tests.back().Index =
            1 + static_cast<int>(std::distance(this->TestList.begin(), lotIt));
          ++fixtureTestsAdded;

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Added setup test "
                               << p.Name << " required by fixture "
                               << requiredFixtureName << std::endl,
                             this->Quiet);
        }
      }

      // Only add cleanup tests if this fixture has not been excluded
      if (cleanupRegExp.empty() ||
          !excludeCleanupRegex.find(requiredFixtureName)) {
        std::pair<FixtureDepsIterator, FixtureDepsIterator> fixtureRange =
          fixtureCleanups.equal_range(requiredFixtureName);
        for (auto it = fixtureRange.first; it != fixtureRange.second; ++it) {
          ListOfTests::const_iterator lotIt = it->second;
          const cmCTestTestProperties& p = *lotIt;

          if (!addedTests.insert(p.Name).second) {
            // Already have p in our test list
            continue;
          }

          // This is a test not yet in our list, so add it and
          // update its index to reflect where it was in the original
          // full list of all tests (needed to track individual tests
          // across ctest runs for re-run failed, etc.)
          tests.push_back(p);
          tests.back().Index =
            1 + static_cast<int>(std::distance(this->TestList.begin(), lotIt));
          ++fixtureTestsAdded;

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Added cleanup test "
                               << p.Name << " required by fixture "
                               << requiredFixtureName << std::endl,
                             this->Quiet);
        }
      }
    }

    // 2. Record all setup fixtures included in the final list of tests
    for (std::string const& setupFixtureName : tests[i].FixturesSetup) {
      if (setupFixtureName.empty()) {
        continue;
      }

      setupFixturesAdded[setupFixtureName].push_back(i);
    }
  }

  // Now that we have the final list of tests, we can update all cleanup
  // tests to depend on those tests which require that fixture and on any
  // setup tests for that fixture. The latter is required to handle the
  // pathological case where setup and cleanup tests are in the test set
  // but no other test has that fixture as a requirement.
  for (cmCTestTestProperties& p : tests) {
    const std::set<std::string>& cleanups = p.FixturesCleanup;
    for (std::string const& fixture : cleanups) {
      // This cleanup test could be part of the original test list that was
      // passed in. It is then possible that no other test requires the
      // fIt fixture, so we have to check for this.
      auto cIt = fixtureRequirements.find(fixture);
      if (cIt != fixtureRequirements.end()) {
        const std::vector<size_t>& indices = cIt->second;
        for (size_t index : indices) {
          const std::string& reqTestName = tests[index].Name;
          if (!cm::contains(p.Depends, reqTestName)) {
            p.Depends.push_back(reqTestName);
          }
        }
      }

      // Ensure fixture cleanup tests always run after their setup tests, even
      // if no other test cases require the fixture
      cIt = setupFixturesAdded.find(fixture);
      if (cIt != setupFixturesAdded.end()) {
        const std::vector<size_t>& indices = cIt->second;
        for (size_t index : indices) {
          const std::string& setupTestName = tests[index].Name;
          if (!cm::contains(p.Depends, setupTestName)) {
            p.Depends.push_back(setupTestName);
          }
        }
      }
    }
  }

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Added " << fixtureTestsAdded
                              << " tests to meet fixture requirements"
                              << std::endl,
                     this->Quiet);
}